

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc.c
# Opt level: O3

int Saig_ManFramesCount_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
    iVar2 = 0;
    do {
      if (pObj->TravId == p->nTravIds) {
        return iVar2;
      }
      pObj->TravId = p->nTravIds;
      iVar1 = Saig_ManFramesCount_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      iVar2 = iVar2 + iVar1 + 1;
    } while (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7);
  }
  return iVar2;
}

Assistant:

int Saig_ManFramesCount_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( !Aig_ObjIsNode(pObj) )
        return 0;
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Aig_ObjSetTravIdCurrent(p, pObj);
    return 1 + Saig_ManFramesCount_rec( p, Aig_ObjFanin0(pObj) ) + 
        Saig_ManFramesCount_rec( p, Aig_ObjFanin1(pObj) );
}